

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
chains::Parameter<chains::phasor::Frequency>::name_abi_cxx11_
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Parameter<chains::phasor::Frequency> *this)

{
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->moduleName_ == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"Frequency",(allocator<char> *)&local_50);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,this->moduleName_,&local_51);
    std::operator+(&local_50,&local_30,' ');
    std::operator+(__return_storage_ptr__,&local_50,"Frequency");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

auto name() const
  {
    if (moduleName_) {
      return std::string{moduleName_} + ' ' + Traits::name();
    } else {
      return std::string{Traits::name()};
    }
  }